

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.cpp
# Opt level: O3

void __thiscall
wavingz::demod::state_machine::sample_sm::lead_in_t::process
          (lead_in_t *this,sample_sm_t *ctx,optional<bool> *sample)

{
  bool bVar1;
  state_base_t *psVar2;
  size_t sVar3;
  state_base_t *psVar4;
  byte bVar5;
  
  bVar5 = (sample->super_type).m_initialized;
  if ((bool)bVar5 == false) {
    psVar4 = (state_base_t *)operator_new(8);
    psVar4->_vptr_state_base_t = (_func_int **)&PTR_process_0011ad08;
    psVar2 = (ctx->current_state_m)._M_t.
             super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
             .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>
             ._M_head_impl;
    (ctx->current_state_m)._M_t.
    super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
    .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>.
    _M_head_impl = psVar4;
    if (psVar2 != (state_base_t *)0x0) {
      operator_delete(psVar2);
      return;
    }
  }
  else {
    bVar1 = (sample->super_type).m_storage;
    if ((bVar1 != this->last_sample) &&
       (sVar3 = this->counter + 1, this->counter = sVar3, sVar3 == 10)) {
      psVar4 = (state_base_t *)operator_new(0x20);
      psVar4->_vptr_state_base_t = (_func_int **)&PTR_process_0011ac48;
      psVar4[1]._vptr_state_base_t = (_func_int **)0x0;
      psVar4[2]._vptr_state_base_t = (_func_int **)0x0;
      *(bool *)&psVar4[3]._vptr_state_base_t = bVar1;
      psVar2 = (ctx->current_state_m)._M_t.
               super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
               ._M_t.
               super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
               .
               super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>
               ._M_head_impl;
      (ctx->current_state_m)._M_t.
      super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
      ._M_t.
      super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
      .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>.
      _M_head_impl = psVar4;
      if (psVar2 != (state_base_t *)0x0) {
        operator_delete(psVar2);
        bVar5 = (sample->super_type).m_initialized;
      }
    }
    if ((bVar5 & 1) == 0) {
      __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bb,
                    "reference_const_type boost::optional<bool>::get() const [T = bool]");
    }
    this->last_sample = (sample->super_type).m_storage;
  }
  return;
}

Assistant:

void
lead_in_t::process(sample_sm_t& ctx, const boost::optional<bool>& sample)
{
    const size_t LEAD_IN_SYMBOLS = 10;

    // On no signal, return to idle
    if (sample == boost::none)
    {
        ctx.state(std::unique_ptr<idle_t>(new idle_t()));
    }
    else
    {
        // skip the first few samples to synchronize
        if (*sample != last_sample)
        {
            if (++counter == LEAD_IN_SYMBOLS)
            {
                ctx.state(std::unique_ptr<preamble_t>(new preamble_t(*sample)));
            }
        }
        last_sample = *sample;
    }
}